

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.h
# Opt level: O0

NetInterface * FS::operator<<(NetInterface *sink,StateArg sA)

{
  Type TVar1;
  int i;
  NetInterface *sink_local;
  StateArg sA_local;
  
  sink_local = (NetInterface *)sA;
  TVar1 = StateArg::getType((StateArg *)&sink_local);
  if (TVar1 == NONE) {
    ::operator<<(sink,"NoArg");
  }
  else {
    if (TVar1 != INT) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/glowmouse[P]beefocus/firmware/focuser_state.h"
                    ,0x1d8,"T &FS::operator<<(T &, StateArg) [T = NetInterface]");
    }
    i = StateArg::getInt((StateArg *)&sink_local);
    ::operator<<(sink,i);
  }
  return sink;
}

Assistant:

T& operator<<( T& sink, StateArg sA )
{
  switch (sA.getType() )
  {
    case StateArg::Type::NONE:
      sink << "NoArg";
      break;
    case StateArg::Type::INT:
      sink << sA.getInt();
      break;
    default:
      assert(0);
  }
  return sink; 
}